

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_getweakrefval(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  SQString *pSVar2;
  SQObjectPtr *pSVar3;
  SQRESULT SVar4;
  SQObjectPtr local_18;
  
  if (idx < 0) {
    pSVar3 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar3 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  if ((pSVar3->super_SQObject)._type == OT_WEAKREF) {
    pSVar2 = (pSVar3->super_SQObject)._unVal.pString;
    local_18.super_SQObject._type = *(SQObjectType *)&pSVar2->_sharedstate;
    local_18.super_SQObject._unVal = (SQObjectValue)pSVar2->_next;
    if ((local_18.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    SQVM::Push(v,&local_18);
    SQObjectPtr::~SQObjectPtr(&local_18);
    SVar4 = 0;
  }
  else {
    sq_throwerror(v,"the object must be a weakref");
    SVar4 = -1;
  }
  return SVar4;
}

Assistant:

SQRESULT sq_getweakrefval(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v,idx);
    if(type(o) != OT_WEAKREF) {
        return sq_throwerror(v,_SC("the object must be a weakref"));
    }
    v->Push(_weakref(o)->_obj);
    return SQ_OK;
}